

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O2

void __thiscall
cppcms::url_dispatcher::assign<unit_test>
          (url_dispatcher *this,string *regex,member_type member,unit_test *object)

{
  _Function_base local_50;
  undefined1 local_30 [24];
  
  local_30._0_8_ = member;
  local_30._8_8_ = object;
  std::function<void()>::function<cppcms::url_dispatcher::binder0<unit_test>,void>
            ((function<void()> *)&local_50,(binder0<unit_test> *)local_30);
  cppcms::url_dispatcher::assign(this,regex,&local_50);
  std::_Function_base::~_Function_base(&local_50);
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(),C *object)
		{
			assign(regex,binder0<C>(member,object));
		}